

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,SrcItem *pSrc)

{
  Select **ppSVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  Select *pSel;
  Select *pSVar5;
  Expr *pEVar6;
  Select *pSVar7;
  int iVar8;
  ulong uVar9;
  SubstContext x;
  SubstContext local_88;
  Walker local_60;
  
  iVar8 = 0;
  iVar3 = 0;
  if (((pWhere != (Expr *)0x0) && (iVar3 = iVar8, (pSubq->selFlags & 0x2002000) == 0)) &&
     (((pSrc->fg).jointype & 0x50) == 0)) {
    pSVar5 = pSubq;
    if (pSubq->pPrior == (Select *)0x0) {
      if ((pSubq->pWin != (Window *)0x0) && (pSubq->pWin->pPartition == (ExprList *)0x0)) {
        return 0;
      }
    }
    else {
      do {
        if ((pSVar5->op != 0x8a) && (pSVar5->op != 0x87)) {
          return 0;
        }
        if (pSVar5->pWin != (Window *)0x0) {
          return 0;
        }
        ppSVar1 = &pSVar5->pPrior;
        pSVar5 = *ppSVar1;
      } while (*ppSVar1 != (Select *)0x0);
    }
    if (pSubq->pLimit == (Expr *)0x0) {
      iVar8 = 0;
      if (pWhere->op == ',') {
        iVar8 = 0;
        do {
          iVar3 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,pSrc);
          iVar8 = iVar8 + iVar3;
          pWhere = pWhere->pLeft;
        } while (pWhere->op == ',');
      }
      iVar4 = sqlite3ExprIsTableConstraint(pWhere,pSrc);
      iVar3 = iVar8;
      if (iVar4 != 0) {
        pbVar2 = (byte *)((long)&pSubq->selFlags + 3);
        *pbVar2 = *pbVar2 | 1;
        iVar3 = iVar8 + 1;
        do {
          pEVar6 = exprDup(pParse->db,pWhere,0,(u8 **)0x0);
          unsetJoinExpr(pEVar6,-1,1);
          local_88.iTable = pSrc->iCursor;
          local_88.isOuterJoin = 0;
          local_88.pEList = pSubq->pEList;
          pSVar5 = pSubq;
          do {
            pSVar7 = pSVar5;
            pSVar5 = pSVar7->pPrior;
          } while (pSVar5 != (Select *)0x0);
          local_88.pCList = pSVar7->pEList;
          local_88.pParse = pParse;
          local_88.iNewTable = local_88.iTable;
          pEVar6 = substExpr(&local_88,pEVar6);
          if (pSubq->pWin != (Window *)0x0) {
            local_60.u = (anon_union_8_17_dfc45e9e_for_u)pSubq->pWin->pPartition;
            local_60.eCode = 1;
            local_60.xExprCallback = exprNodeIsConstantOrGroupBy;
            local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
            local_60.pParse = pParse;
            if ((pEVar6 != (Expr *)0x0) && (walkExpr(&local_60,pEVar6), local_60.eCode == 0)) {
              sqlite3ExprDeleteNN(pParse->db,pEVar6);
              return iVar8;
            }
          }
          uVar9 = (ulong)(pSubq->selFlags & 8);
          pEVar6 = sqlite3ExprAnd(pParse,*(Expr **)((long)pSubq->addrOpenEphm + uVar9 * 2 + 0x1c),
                                  pEVar6);
          *(Expr **)((long)pSubq->addrOpenEphm + uVar9 * 2 + 0x1c) = pEVar6;
          pSubq = pSubq->pPrior;
        } while (pSubq != (Select *)0x0);
      }
    }
  }
  return iVar3;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  SrcItem *pSrc         /* The subquery term of the outer FROM clause */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & (SF_Recursive|SF_MultiPart) ) return 0;
  if( pSrc->fg.jointype & (JT_LTORJ|JT_RIGHT) ) return 0;

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pPrior ){
    Select *pSel;
    for(pSel=pSubq; pSel; pSel=pSel->pPrior){
      u8 op = pSel->op;
      assert( op==TK_ALL || op==TK_SELECT
           || op==TK_UNION || op==TK_INTERSECT || op==TK_EXCEPT );
      if( op!=TK_ALL && op!=TK_SELECT ) return 0;  /* restriction (8) */
      if( pSel->pWin ) return 0;    /* restriction (6b) */
    }
  }else{
    if( pSubq->pWin && pSubq->pWin->pPartition==0 ) return 0;
  }
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, pSrc);
    pWhere = pWhere->pLeft;
  }

#if 0  /* Legacy code. Checks now done by sqlite3ExprIsTableConstraint() */
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_OuterON)==0
         || pWhere->w.iJoin!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_OuterON)
   && pWhere->w.iJoin!=iCursor
  ){
    return 0; /* restriction (5) */
  }
#endif

  if( sqlite3ExprIsTableConstraint(pWhere, pSrc) ){
    nChng++;
    pSubq->selFlags |= SF_PushDown;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1, 1);
      x.pParse = pParse;
      x.iTable = pSrc->iCursor;
      x.iNewTable = pSrc->iCursor;
      x.isOuterJoin = 0;
      x.pEList = pSubq->pEList;
      x.pCList = findLeftmostExprlist(pSubq);
      pNew = substExpr(&x, pNew);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSubq->pWin && 0==pushDownWindowCheck(pParse, pSubq, pNew) ){
        /* Restriction 6c has prevented push-down in this case */
        sqlite3ExprDelete(pParse->db, pNew);
        nChng--;
        break;
      }
#endif
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}